

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,string *insertion_content,size_t insertion_offset,
          size_t insertion_length,size_t indent_length)

{
  pointer pcVar1;
  GeneratorContextImpl *pGVar2;
  pointer pcVar3;
  GeneratedCodeInfo_Annotation *from;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  ostream *poVar7;
  GeneratedCodeInfo_Annotation *pGVar8;
  long lVar9;
  void **ppvVar10;
  _Base_ptr data;
  long lVar11;
  long lVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar13;
  GeneratedCodeInfo new_metadata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  GeneratedCodeInfo metadata;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  int local_98 [4];
  size_t local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  GeneratedCodeInfo local_60;
  
  pGVar2 = this->directory_;
  pcVar1 = local_c8 + 0x10;
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  local_c8._0_8_ = pcVar1;
  local_88 = insertion_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar3,pcVar3 + (this->filename_)._M_string_length);
  std::__cxx11::string::append((char *)local_c8);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(pGVar2->files_)._M_t,(key_type *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (((_Rb_tree_header *)iVar6._M_node ==
       &(this->directory_->files_)._M_t._M_impl.super__Rb_tree_header) &&
     ((this->info_to_insert_).annotation_.super_RepeatedPtrFieldBase.current_size_ == 0)) {
    return;
  }
  GeneratedCodeInfo::GeneratedCodeInfo(&local_60,(Arena *)0x0,false);
  pGVar2 = this->directory_;
  if ((_Rb_tree_header *)iVar6._M_node == &(pGVar2->files_)._M_t._M_impl.super__Rb_tree_header) {
    pcVar3 = (this->filename_)._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + (this->filename_)._M_string_length);
    std::__cxx11::string::append((char *)&local_80);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[1],_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c8,&local_80,(char (*) [1])0x3e25d9);
    pVar13 = std::
             _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                       ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&pGVar2->files_,
                        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_c8);
    if ((int *)local_a8._M_p != local_98) {
      operator_delete(local_a8._M_p);
    }
    if ((pointer)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    data = pVar13.first._M_node._M_node + 2;
LAB_00230575:
    bVar4 = false;
  }
  else {
    data = iVar6._M_node + 2;
    bVar4 = MessageLite::ParseFromString((MessageLite *)&local_60,(ConstStringParam)data);
    if (bVar4) goto LAB_00230575;
    bVar5 = TextFormat::ParseFromString((ConstStringParam)data,&local_60.super_Message);
    bVar4 = true;
    if (!bVar5) {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->filename_)._M_dataplus._M_p,
                          (this->filename_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,".pb.meta: Could not parse metadata as wire or text format.",0x3a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      goto LAB_002306cb;
    }
  }
  GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)local_c8,(Arena *)0x0,false);
  ppvVar10 = (local_60.annotation_.super_RepeatedPtrFieldBase.rep_)->elements;
  if (local_60.annotation_.super_RepeatedPtrFieldBase.rep_ == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if ((long)local_60.annotation_.super_RepeatedPtrFieldBase.current_size_ == 0) {
LAB_00230681:
    InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                      (GeneratedCodeInfo *)local_c8);
  }
  else {
    lVar12 = 0;
    lVar11 = 0;
    bVar5 = false;
    do {
      from = *(GeneratedCodeInfo_Annotation **)((long)ppvVar10 + lVar12);
      if ((insertion_offset <= (ulong)(long)from->begin_) && (!bVar5)) {
        InsertShiftedInfo(this,insertion_content,insertion_offset,indent_length,
                          (GeneratedCodeInfo *)local_c8);
        lVar11 = lVar11 + local_88;
        bVar5 = true;
      }
      if (((int *)local_a8._M_p == (int *)0x0) ||
         (lVar9 = (long)(int)local_c8._24_4_, *(int *)local_a8._M_p <= (int)local_c8._24_4_)) {
        pGVar8 = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                           ((Arena *)local_c8._16_8_);
        pGVar8 = (GeneratedCodeInfo_Annotation *)
                 internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                           ((RepeatedPtrFieldBase *)(local_c8 + 0x10),pGVar8);
      }
      else {
        local_c8._24_4_ = local_c8._24_4_ + 1;
        pGVar8 = *(GeneratedCodeInfo_Annotation **)(local_a8._M_p + lVar9 * 8 + 8);
      }
      GeneratedCodeInfo_Annotation::CopyFrom(pGVar8,from);
      pGVar8->begin_ = pGVar8->begin_ + (int)lVar11;
      *(byte *)(pGVar8->_has_bits_).has_bits_ = (byte)(pGVar8->_has_bits_).has_bits_[0] | 6;
      pGVar8->end_ = pGVar8->end_ + (int)lVar11;
      lVar12 = lVar12 + 8;
    } while ((long)local_60.annotation_.super_RepeatedPtrFieldBase.current_size_ * 8 != lVar12);
    if (!bVar5) goto LAB_00230681;
  }
  if (bVar4) {
    TextFormat::PrintToString((Message *)local_c8,(string *)data);
  }
  else {
    MessageLite::SerializeToString((MessageLite *)local_c8,(string *)data);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)local_c8);
LAB_002306cb:
  GeneratedCodeInfo::~GeneratedCodeInfo(&local_60);
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    const std::string& insertion_content, size_t insertion_offset,
    size_t insertion_length, size_t indent_length) {
  auto it = directory_->files_.find(filename_ + ".pb.meta");
  if (it == directory_->files_.end() && info_to_insert_.annotation().empty()) {
    // No metadata was recorded for this file.
    return;
  }
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  std::string* encoded_data = nullptr;
  if (it != directory_->files_.end()) {
    encoded_data = &it->second;
    // Try to decode a GeneratedCodeInfo proto from the .pb.meta file. It may be
    // in wire or text format. Keep the same format when the data is written out
    // later.
    if (!metadata.ParseFromString(*encoded_data)) {
      if (!TextFormat::ParseFromString(*encoded_data, &metadata)) {
        // The metadata is invalid.
        std::cerr
            << filename_
            << ".pb.meta: Could not parse metadata as wire or text format."
            << std::endl;
        return;
      }
      // Generators that use the public plugin interface emit text-format
      // metadata (because in the public plugin protocol, file content must be
      // UTF8-encoded strings).
      is_text_format = true;
    }
  } else {
    // Create a new file to store the new metadata in info_to_insert_.
    encoded_data =
        &directory_->files_.insert({filename_ + ".pb.meta", ""}).first->second;
  }
  GeneratedCodeInfo new_metadata;
  bool crossed_offset = false;
  size_t to_add = 0;
  for (const auto& source_annotation : metadata.annotation()) {
    // The first time an annotation at or after the insertion point is found,
    // insert the new metadata from info_to_insert_. Shift all annotations
    // after the new metadata by the length of the text that was inserted
    // (including any additional indent length).
    if (source_annotation.begin() >= insertion_offset && !crossed_offset) {
      crossed_offset = true;
      InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                        new_metadata);
      to_add += insertion_length;
    }
    GeneratedCodeInfo::Annotation* annotation = new_metadata.add_annotation();
    *annotation = source_annotation;
    annotation->set_begin(annotation->begin() + to_add);
    annotation->set_end(annotation->end() + to_add);
  }
  // If there were never any annotations at or after the insertion point,
  // make sure to still insert the new metadata from info_to_insert_.
  if (!crossed_offset) {
    InsertShiftedInfo(insertion_content, insertion_offset, indent_length,
                      new_metadata);
  }
  if (is_text_format) {
    TextFormat::PrintToString(new_metadata, encoded_data);
  } else {
    new_metadata.SerializeToString(encoded_data);
  }
}